

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::getNextLeak
          (MemoryLeakDetectorTable *this,MemoryLeakDetectorNode *leak,MemLeakPeriod period)

{
  MemoryLeakDetectorNode *pMVar1;
  long in_RSI;
  MemoryLeakDetectorNode *in_RDI;
  MemoryLeakDetectorNode *node;
  unsigned_long i;
  MemoryLeakDetectorList *in_stack_ffffffffffffffd0;
  ulong local_28;
  
  local_28 = hash((MemoryLeakDetectorTable *)in_RDI,*(char **)(in_RSI + 0x10));
  pMVar1 = MemoryLeakDetectorList::getNextLeak(in_stack_ffffffffffffffd0,in_RDI,mem_leak_period_all)
  ;
  while( true ) {
    if (pMVar1 != (MemoryLeakDetectorNode *)0x0) {
      return pMVar1;
    }
    local_28 = local_28 + 1;
    if (0x48 < local_28) break;
    pMVar1 = MemoryLeakDetectorList::getFirstLeak
                       ((MemoryLeakDetectorList *)0x0,(MemLeakPeriod)((ulong)in_RDI >> 0x20));
  }
  return (MemoryLeakDetectorNode *)0x0;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::getNextLeak(MemoryLeakDetectorNode* leak, MemLeakPeriod period)
{
    unsigned long i = hash(leak->memory_);
    MemoryLeakDetectorNode* node = table_[i].getNextLeak(leak, period);
    if (node) return node;

    for (++i; i < hash_prime; i++) {
        node = table_[i].getFirstLeak(period);
        if (node) return node;
    }
    return NULLPTR;
}